

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdGetLastErrorMessage(void *handle,char **message)

{
  CfdException *this;
  long lVar1;
  void *pvVar2;
  undefined8 *in_RSI;
  CfdException *except;
  char *buffer;
  size_t len;
  string err_str;
  CfdException last_error;
  void *in_stack_000000e0;
  CfdCapiManager *in_stack_000000e8;
  allocator local_79;
  string local_78 [96];
  undefined8 *local_18;
  int local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = 1;
  }
  else {
    local_18 = in_RSI;
    cfd::capi::CfdCapiManager::GetLastError(in_stack_000000e8,in_stack_000000e0);
    this = (CfdException *)cfd::core::CfdException::what((CfdException *)0x577507);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,(char *)this,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    lVar1 = std::__cxx11::string::length();
    pvVar2 = malloc(lVar1 + 1U);
    if (pvVar2 == (void *)0x0) {
      local_4 = 2;
    }
    else {
      std::__cxx11::string::copy((char *)local_78,(ulong)pvVar2,lVar1 + 1U);
      *(undefined1 *)((long)pvVar2 + lVar1) = 0;
      *local_18 = pvVar2;
      local_4 = 0;
    }
    std::__cxx11::string::~string(local_78);
    cfd::core::CfdException::~CfdException(this);
  }
  return local_4;
}

Assistant:

int CfdGetLastErrorMessage(void* handle, char** message) {
  try {
    if (message == nullptr) return kCfdIllegalArgumentError;
    CfdException last_error = cfd::capi::capi_instance.GetLastError(handle);
    std::string err_str(last_error.what());
    size_t len = err_str.length() + 1;
    char* buffer = static_cast<char*>(malloc(len));
    if (buffer == nullptr) return kCfdIllegalStateError;
    err_str.copy(buffer, len);
    buffer[len - 1] = '\0';
    *message = buffer;
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}